

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::(anonymous_namespace)::jacobiRotateRight<float,0,2>
               (Matrix33<float> *A,float c,float s)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  for (lVar3 = 8; lVar3 != 0x2c; lVar3 = lVar3 + 0xc) {
    fVar1 = *(float *)((long)(A->x + -1) + 4 + lVar3);
    fVar2 = *(float *)((long)A->x[0] + lVar3);
    *(float *)((long)(A->x + -1) + 4 + lVar3) = c * fVar1 - fVar2 * s;
    *(float *)((long)A->x[0] + lVar3) = fVar1 * s + fVar2 * c;
  }
  return;
}

Assistant:

void
jacobiRotateRight (
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A, const T c, const T s)
{
    for (int i = 0; i < 3; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j]      = c * tau1 - s * tau2;
        A[i][k]      = s * tau1 + c * tau2;
    }
}